

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

bool __thiscall
mpt::typed_array<mpt::reference<mpt::metatype>_*>::insert
          (typed_array<mpt::reference<mpt::metatype>_*> *this,long pos,
          reference<mpt::metatype> **val)

{
  content<mpt::reference<mpt::metatype>_*> *pcVar1;
  bool bVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  pcVar1 = (this->super_unique_array<mpt::reference<mpt::metatype>_*>)._ref._ref;
  if (pcVar1 == (content<mpt::reference<mpt::metatype>_*> *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (pcVar1->super_buffer)._used >> 3;
  }
  if (pos < 0) {
    pos = pos + uVar4;
    if (pos < 0) {
      return false;
    }
  }
  else if (uVar4 <= (ulong)pos) {
    uVar4 = pos;
  }
  bVar2 = unique_array<mpt::reference<mpt::metatype>_*>::reserve
                    (&this->super_unique_array<mpt::reference<mpt::metatype>_*>,uVar4 + 1);
  if ((bVar2) &&
     (puVar3 = (undefined8 *)
               mpt::buffer::insert((ulong)(this->super_unique_array<mpt::reference<mpt::metatype>_*>
                                          )._ref._ref,pos << 3), puVar3 != (undefined8 *)0x0)) {
    *puVar3 = *val;
    return true;
  }
  return false;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}